

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktUniformBlockCase.cpp
# Opt level: O0

void vkt::ubo::anon_unknown_0::generateCompareSrc
               (ostringstream *src,char *resultVar,ShaderInterface *interface,UniformLayout *layout,
               map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
               *blockPointers,bool isVertex,MatrixLoadFlags matrixLoadFlag)

{
  void *basePtr_00;
  bool bVar1;
  uint unusedMask_00;
  int iVar2;
  deUint32 dVar3;
  UniformBlock *this;
  string *psVar4;
  pointer ppVar5;
  reference this_00;
  VarType *type;
  uint uVar6;
  int local_1f8;
  undefined1 local_1e8 [8];
  string apiName;
  string srcName;
  Uniform *uniform;
  __normal_iterator<const_vkt::ubo::Uniform_*,_std::vector<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>_>
  local_198;
  ConstIterator uniformIter;
  void *basePtr;
  int blockLayoutNdx;
  undefined1 local_158 [8];
  string srcPrefix;
  string blockInstanceName;
  string local_110;
  byte local_eb;
  byte local_ea;
  allocator<char> local_e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined1 local_a8 [8];
  string instancePostfix;
  int instanceNdx;
  allocator<char> local_71;
  undefined1 local_70 [8];
  string apiPrefix;
  int numInstances;
  bool isArray;
  bool hasInstanceName;
  UniformBlock *block;
  int blockNdx;
  deUint32 unusedMask;
  bool isVertex_local;
  map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
  *blockPointers_local;
  UniformLayout *layout_local;
  ShaderInterface *interface_local;
  char *resultVar_local;
  ostringstream *src_local;
  
  unusedMask_00 = 0x1000;
  if (isVertex) {
    unusedMask_00 = 0x800;
  }
  for (block._4_4_ = 0; iVar2 = ShaderInterface::getNumUniformBlocks(interface), block._4_4_ < iVar2
      ; block._4_4_ = block._4_4_ + 1) {
    this = ShaderInterface::getUniformBlock(interface,block._4_4_);
    dVar3 = UniformBlock::getFlags(this);
    uVar6 = 0x400;
    if (isVertex) {
      uVar6 = 0x200;
    }
    if ((dVar3 & uVar6) != 0) {
      apiPrefix.field_2._M_local_buf[0xf] = UniformBlock::hasInstanceName(this);
      apiPrefix.field_2._M_local_buf[0xe] = UniformBlock::isArray(this);
      if ((bool)apiPrefix.field_2._M_local_buf[0xe]) {
        local_1f8 = UniformBlock::getArraySize(this);
      }
      else {
        local_1f8 = 1;
      }
      apiPrefix.field_2._8_4_ = local_1f8;
      if ((apiPrefix.field_2._M_local_buf[0xf] & 1U) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)local_70,"",&local_71);
        std::allocator<char>::~allocator(&local_71);
      }
      else {
        psVar4 = UniformBlock::getBlockName_abi_cxx11_(this);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70
                       ,psVar4,".");
      }
      for (instancePostfix.field_2._8_4_ = 0;
          (int)instancePostfix.field_2._8_4_ < (int)apiPrefix.field_2._8_4_;
          instancePostfix.field_2._8_4_ = instancePostfix.field_2._8_4_ + 1) {
        local_ea = 0;
        local_eb = 0;
        blockInstanceName.field_2._M_local_buf[0xf] = '\0';
        blockInstanceName.field_2._M_local_buf[0xe] = '\0';
        blockInstanceName.field_2._M_local_buf[0xc] = '\0';
        if ((apiPrefix.field_2._M_local_buf[0xe] & 1U) == 0) {
          std::allocator<char>::allocator();
          blockInstanceName.field_2._M_local_buf[0xc] = '\x01';
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_a8,"",
                     (allocator<char> *)(blockInstanceName.field_2._M_local_buf + 0xd));
        }
        else {
          std::allocator<char>::allocator();
          local_ea = 1;
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"[",&local_e9);
          local_eb = 1;
          de::toString<int>(&local_110,(int *)(instancePostfix.field_2._M_local_buf + 8));
          blockInstanceName.field_2._M_local_buf[0xf] = '\x01';
          std::operator+(&local_c8,&local_e8,&local_110);
          blockInstanceName.field_2._M_local_buf[0xe] = '\x01';
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_a8,&local_c8,"]");
        }
        if ((blockInstanceName.field_2._M_local_buf[0xc] & 1U) != 0) {
          std::allocator<char>::~allocator
                    ((allocator<char> *)(blockInstanceName.field_2._M_local_buf + 0xd));
        }
        if ((blockInstanceName.field_2._M_local_buf[0xe] & 1U) != 0) {
          std::__cxx11::string::~string((string *)&local_c8);
        }
        if ((blockInstanceName.field_2._M_local_buf[0xf] & 1U) != 0) {
          std::__cxx11::string::~string((string *)&local_110);
        }
        if ((local_eb & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_e8);
        }
        if ((local_ea & 1) != 0) {
          std::allocator<char>::~allocator(&local_e9);
        }
        psVar4 = UniformBlock::getBlockName_abi_cxx11_(this);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&srcPrefix.field_2 + 8),psVar4,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8
                      );
        basePtr._7_1_ = 0;
        basePtr._5_1_ = 0;
        if ((apiPrefix.field_2._M_local_buf[0xf] & 1U) == 0) {
          std::allocator<char>::allocator();
          basePtr._5_1_ = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_158,"",(allocator<char> *)((long)&basePtr + 6));
        }
        else {
          psVar4 = UniformBlock::getInstanceName_abi_cxx11_(this);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &blockLayoutNdx,psVar4,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_a8);
          basePtr._7_1_ = 1;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_158,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &blockLayoutNdx,".");
        }
        if ((basePtr._5_1_ & 1) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)((long)&basePtr + 6));
        }
        if ((basePtr._7_1_ & 1) != 0) {
          std::__cxx11::string::~string((string *)&blockLayoutNdx);
        }
        basePtr._0_4_ =
             UniformLayout::getBlockLayoutIndex(layout,block._4_4_,instancePostfix.field_2._8_4_);
        uniformIter._M_current =
             (Uniform *)
             std::map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>::
             find(blockPointers,(key_type_conflict *)&basePtr);
        ppVar5 = std::_Rb_tree_const_iterator<std::pair<const_int,_void_*>_>::operator->
                           ((_Rb_tree_const_iterator<std::pair<const_int,_void_*>_> *)&uniformIter);
        basePtr_00 = ppVar5->second;
        local_198._M_current = (Uniform *)UniformBlock::begin(this);
        while( true ) {
          uniform = (Uniform *)UniformBlock::end(this);
          bVar1 = __gnu_cxx::operator!=
                            (&local_198,
                             (__normal_iterator<const_vkt::ubo::Uniform_*,_std::vector<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>_>
                              *)&uniform);
          if (!bVar1) break;
          this_00 = __gnu_cxx::
                    __normal_iterator<const_vkt::ubo::Uniform_*,_std::vector<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>_>
                    ::operator*(&local_198);
          dVar3 = Uniform::getFlags(this_00);
          if ((dVar3 & unusedMask_00) == 0) {
            psVar4 = Uniform::getName_abi_cxx11_(this_00);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&apiName.field_2 + 8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_158,psVar4);
            psVar4 = Uniform::getName_abi_cxx11_(this_00);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1e8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_70,psVar4);
            type = Uniform::getType(this_00);
            generateCompareSrc(src,resultVar,type,(string *)((long)&apiName.field_2 + 8),
                               (string *)local_1e8,layout,block._4_4_,basePtr_00,unusedMask_00,
                               matrixLoadFlag);
            std::__cxx11::string::~string((string *)local_1e8);
            std::__cxx11::string::~string((string *)(apiName.field_2._M_local_buf + 8));
          }
          __gnu_cxx::
          __normal_iterator<const_vkt::ubo::Uniform_*,_std::vector<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>_>
          ::operator++(&local_198,0);
        }
        std::__cxx11::string::~string((string *)local_158);
        std::__cxx11::string::~string((string *)(srcPrefix.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_a8);
      }
      std::__cxx11::string::~string((string *)local_70);
    }
  }
  return;
}

Assistant:

void generateCompareSrc (std::ostringstream& src,
						 const char* resultVar,
						 const ShaderInterface& interface,
						 const UniformLayout& layout,
						 const std::map<int,
						 void*>& blockPointers,
						 bool isVertex,
						 MatrixLoadFlags matrixLoadFlag)
{
	deUint32 unusedMask = isVertex ? UNUSED_VERTEX : UNUSED_FRAGMENT;

	for (int blockNdx = 0; blockNdx < interface.getNumUniformBlocks(); blockNdx++)
	{
		const UniformBlock& block = interface.getUniformBlock(blockNdx);

		if ((block.getFlags() & (isVertex ? DECLARE_VERTEX : DECLARE_FRAGMENT)) == 0)
			continue; // Skip.

		bool			hasInstanceName	= block.hasInstanceName();
		bool			isArray			= block.isArray();
		int				numInstances	= isArray ? block.getArraySize() : 1;
		std::string		apiPrefix		= hasInstanceName ? block.getBlockName() + "." : std::string("");

		DE_ASSERT(!isArray || hasInstanceName);

		for (int instanceNdx = 0; instanceNdx < numInstances; instanceNdx++)
		{
			std::string		instancePostfix		= isArray ? std::string("[") + de::toString(instanceNdx) + "]" : std::string("");
			std::string		blockInstanceName	= block.getBlockName() + instancePostfix;
			std::string		srcPrefix			= hasInstanceName ? block.getInstanceName() + instancePostfix + "." : std::string("");
			int				blockLayoutNdx		= layout.getBlockLayoutIndex(blockNdx, instanceNdx);
			void*			basePtr				= blockPointers.find(blockLayoutNdx)->second;

			for (UniformBlock::ConstIterator uniformIter = block.begin(); uniformIter != block.end(); uniformIter++)
			{
				const Uniform& uniform = *uniformIter;

				if (uniform.getFlags() & unusedMask)
					continue; // Don't read from that uniform.

				std::string srcName = srcPrefix + uniform.getName();
				std::string apiName = apiPrefix + uniform.getName();
				generateCompareSrc(src, resultVar, uniform.getType(), srcName, apiName, layout, blockNdx, basePtr, unusedMask, matrixLoadFlag);
			}
		}
	}
}